

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
          (WireFormatTest<proto2_unittest::TestAllTypes> *this,string *test_case,string *data)

{
  bool bVar1;
  MessageLite *pMVar2;
  Message *this_00;
  FieldDescriptor *field;
  char *in_R9;
  pointer *__ptr;
  char *pcVar3;
  Metadata MVar4;
  Metadata MVar5;
  string_view data_00;
  string_view data_01;
  string_view name;
  ScopedTrace gtest_trace_82;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  TestMessageSet message_set;
  AssertHelper local_f0;
  ScopedTrace local_e1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  AssertHelper local_b0;
  undefined1 local_a8 [8];
  InternalMetadata IStack_a0;
  anon_union_32_1_493b367e_for_TestMessageSet_3 local_98;
  undefined1 local_70 [16];
  undefined1 local_60 [40];
  int local_38;
  DescriptorPool *local_30;
  MessageFactory *pMStack_28;
  
  testing::ScopedTrace::ScopedTrace
            (&local_e1,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
             ,0x52,test_case);
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet
            ((TestMessageSet *)local_70,(Arena *)0x0);
  data_00._M_str = (data->_M_dataplus)._M_p;
  data_00._M_len = data->_M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)local_70,data_00);
  local_d0[0] = (internal)bVar1;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_d0,
               (AssertionResult *)"message_set.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,
                      (ulong)((long)&((local_98._impl_._extensions_.arena_)->impl_).tag_and_id_ + 1)
                     );
    }
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
    if (!bVar1) {
      proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_70);
      goto LAB_009eada0;
    }
  }
  local_d0._0_4_ = 0x7b;
  pMVar2 = ExtensionSet::GetMessage
                     ((ExtensionSet *)local_60,
                      proto2_unittest::TestMessageSetExtension1::message_set_extension,
                      (MessageLite *)PTR__TestMessageSetExtension1_default_instance__019d05a0);
  local_e0._M_head_impl._0_4_ = (int)pMVar2[2]._internal_metadata_.ptr_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a8,"123",
             "message_set .GetExtension( TestMessageSetExtension1::message_set_extension) .i()",
             (int *)local_d0,(int *)&local_e0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_a0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)IStack_a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if ((long *)CONCAT44(local_d0._4_4_,local_d0._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0._4_4_,local_d0._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_a0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&IStack_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_a0.ptr_
                );
  }
  ExtensionSet::ClearExtension
            ((ExtensionSet *)local_60,
             proto2_unittest::TestMessageSetExtension1::message_set_extension);
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_a8,(MessageLite *)local_70);
  pcVar3 = anon_var_dwarf_a12c75 + 5;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)local_d0,"message_set.SerializeAsString()","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
             (char (*) [1])(anon_var_dwarf_a12c75 + 5));
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,
                    (ulong)((long)&((local_98._impl_._extensions_.arena_)->impl_).tag_and_id_ + 1));
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_70);
  if (!bVar1) goto LAB_009eada0;
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet
            ((TestMessageSet *)local_a8,(Arena *)0x0);
  local_70._0_8_ = (data->_M_dataplus)._M_p;
  local_60._8_4_ = (undefined4)data->_M_string_length;
  local_70._8_8_ = local_70._0_8_ + (long)(int)local_60._8_4_;
  local_60._0_8_ = (Arena *)0x0;
  local_60._12_7_ = 0;
  local_60[0x13] = 0;
  local_60[0x14] = '\0';
  local_60._21_2_ = 0;
  local_60._28_4_ = 0;
  local_60._32_4_ = 0x7fffffff;
  local_60._36_4_ = io::CodedInputStream::default_recursion_limit_;
  local_38 = io::CodedInputStream::default_recursion_limit_;
  local_30 = (DescriptorPool *)0x0;
  pMStack_28 = (MessageFactory *)0x0;
  local_60._24_4_ = local_60._8_4_;
  bVar1 = WireFormat::ParseAndMergePartial((CodedInputStream *)local_70,(Message *)local_a8);
  local_e0._M_head_impl._0_1_ = bVar1;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_e0,
               (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &message_set)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x66,(char *)CONCAT44(local_d0._4_4_,local_d0._0_4_));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._4_4_,local_d0._0_4_) != &local_c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_d0._4_4_,local_d0._0_4_),local_c0._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_f0.data_._4_4_,(int32_t)local_f0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_f0.data_._4_4_,(int32_t)local_f0.data_) + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  local_e0._M_head_impl._0_1_ = local_60[0x14];
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60[0x14] == '\0') {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)0x124be39,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x67,(char *)CONCAT44(local_d0._4_4_,local_d0._0_4_));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d0._4_4_,local_d0._0_4_) != &local_c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_d0._4_4_,local_d0._0_4_),local_c0._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_f0.data_._4_4_,(int32_t)local_f0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_f0.data_._4_4_,(int32_t)local_f0.data_) + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  local_e0._M_head_impl._0_4_ = 0x7b;
  pMVar2 = ExtensionSet::GetMessage
                     (&local_98._impl_._extensions_,
                      proto2_unittest::TestMessageSetExtension1::message_set_extension,
                      (MessageLite *)PTR__TestMessageSetExtension1_default_instance__019d05a0);
  local_f0.data_._0_4_ = (int32_t)pMVar2[2]._internal_metadata_.ptr_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d0,"123",
             "message_set .GetExtension( TestMessageSetExtension1::message_set_extension) .i()",
             (int *)&local_e0,(int *)&local_f0);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_70);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)local_a8);
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_70);
  MVar4 = proto2_wireformat_unittest::TestMessageSet::GetMetadata
                    ((TestMessageSet *)proto2_wireformat_unittest::_TestMessageSet_default_instance_
                    );
  pMVar2 = &DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)local_70,MVar4.descriptor)
            ->super_MessageLite;
  pMVar2 = MessageLite::New(pMVar2,(Arena *)0x0);
  data_01._M_str = (data->_M_dataplus)._M_p;
  data_01._M_len = data->_M_string_length;
  MessageLite::ParseFromString(pMVar2,data_01);
  MVar4 = Message::GetMetadata((Message *)pMVar2);
  local_a8 = (undefined1  [8])0x0;
  IStack_a0.ptr_ = 0;
  local_98._impl_._extensions_.arena_ = (Arena *)0x0;
  Reflection::ListFields
            (MVar4.reflection,(Message *)pMVar2,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_a8);
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (IStack_a0.ptr_ - (long)local_a8 >> 3);
  local_f0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"fields.size()","1",(unsigned_long *)&local_e0,(int *)&local_f0);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e0);
LAB_009ead45:
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  else {
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
    this_00 = Reflection::GetMessage
                        (MVar4.reflection,(Message *)pMVar2,*(FieldDescriptor **)local_a8,
                         (MessageFactory *)0x0);
    MVar4 = Message::GetMetadata(this_00);
    local_e0._M_head_impl._0_4_ = 0x7b;
    MVar5 = Message::GetMetadata(this_00);
    name._M_str = "i";
    name._M_len = 1;
    field = Descriptor::FindFieldByName(MVar5.descriptor,name);
    local_f0.data_._0_4_ = Reflection::GetInt32(MVar4.reflection,this_00,field);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d0,"123",
               "reflection->GetInt32( sub, sub.GetDescriptor()->FindFieldByName(\"i\"))",
               (int *)&local_e0,(int *)&local_f0);
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = (local_c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x7b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e0);
      goto LAB_009ead45;
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  if (local_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_a8,(long)local_98._impl_._extensions_.arena_ - (long)local_a8);
  }
  (*pMVar2->_vptr_MessageLite[1])(pMVar2);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_70);
LAB_009eada0:
  testing::ScopedTrace::~ScopedTrace(&local_e1);
  return;
}

Assistant:

void ValidateTestMessageSet(const std::string& test_case,
                              const std::string& data) {
    SCOPED_TRACE(test_case);
    {
      TestMessageSet message_set;
      ASSERT_TRUE(message_set.ParseFromString(data));

      EXPECT_EQ(123, message_set
                         .GetExtension(
                             TestMessageSetExtension1::message_set_extension)
                         .i());

      // Make sure it does not contain anything else.
      message_set.ClearExtension(
          TestMessageSetExtension1::message_set_extension);
      EXPECT_EQ(message_set.SerializeAsString(), "");
    }
    {
      // Test parse the message via Reflection.
      TestMessageSet message_set;
      io::CodedInputStream input(reinterpret_cast<const uint8_t*>(data.data()),
                                 data.size());
      EXPECT_TRUE(WireFormat::ParseAndMergePartial(&input, &message_set));
      EXPECT_TRUE(input.ConsumedEntireMessage());

      EXPECT_EQ(123, message_set
                         .GetExtension(
                             TestMessageSetExtension1::message_set_extension)
                         .i());
    }
    {
      // Test parse the message via DynamicMessage.
      DynamicMessageFactory factory;
      std::unique_ptr<Message> msg(
          factory.GetPrototype(TestMessageSet::descriptor())->New());
      msg->ParseFromString(data);
      auto* reflection = msg->GetReflection();
      std::vector<const FieldDescriptor*> fields;
      reflection->ListFields(*msg, &fields);
      ASSERT_EQ(fields.size(), 1);
      const auto& sub = reflection->GetMessage(*msg, fields[0]);
      reflection = sub.GetReflection();
      EXPECT_EQ(123, reflection->GetInt32(
                         sub, sub.GetDescriptor()->FindFieldByName("i")));
    }
  }